

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature(cmMakefile *this,cmTarget *target,string *feature)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *test;
  char **ppcVar4;
  undefined **ppuVar5;
  ostream *poVar6;
  byte bVar7;
  bool bVar8;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  cmTarget *local_270;
  string local_268;
  cmStrCmp local_248;
  cmStrCmp local_228;
  cmStrCmp local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  needCxx98 = false;
  needCxx11 = false;
  needCxx14 = false;
  CheckNeededCxxLanguage(this,feature,&needCxx98,&needCxx11,&needCxx14);
  std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_268);
  test = cmTarget::GetProperty(target,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  local_270 = target;
  if (test == (char *)0x0) {
    ppuVar5 = &PTR_anon_var_dwarf_2d6da4_005d66b8;
  }
  else {
    cmStrCmp::cmStrCmp(&local_1c8,test);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,&PTR_anon_var_dwarf_2d6da4_005d66b8,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (ppcVar4 == &PTR_anon_var_dwarf_2d6da4_005d66b8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,"The CXX_STANDARD property on target \"");
      poVar6 = std::operator<<(poVar6,(string *)&target->Name);
      poVar6 = std::operator<<(poVar6,"\" contained an invalid value: \"");
      poVar6 = std::operator<<(poVar6,test);
      std::operator<<(poVar6,"\".");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_268,false);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
    cmStrCmp::cmStrCmp(&local_1e8,test);
    ppuVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,&PTR_anon_var_dwarf_2d6da4_005d66b8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  bVar3 = needCxx98;
  bVar2 = needCxx11;
  bVar1 = needCxx14;
  bVar8 = test == (char *)0x0;
  if ((!bVar8 & needCxx14) == 1) {
    cmStrCmp::cmStrCmp(&local_208,"14");
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,&PTR_anon_var_dwarf_2d6da4_005d66b8,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    if (ppcVar4 <= ppuVar5) goto LAB_002f9d22;
LAB_002f9dd5:
    std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_268);
    cmTarget::SetProperty(local_270,(string *)&e,"14");
  }
  else {
LAB_002f9d22:
    if (test == (char *)0x0 || bVar2 != true) {
LAB_002f9d7a:
      bVar7 = bVar8 & bVar3;
      if (test != (char *)0x0 && bVar3 == true) {
        cmStrCmp::cmStrCmp(&local_248,"98");
        ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                            (CXX_STANDARDS,&PTR_anon_var_dwarf_2d6da4_005d66b8,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        bVar7 = bVar7 | ppuVar5 < ppcVar4;
      }
      if ((bVar1 & bVar8) != 0) goto LAB_002f9dd5;
      if ((bVar8 & bVar2) == 0) {
        if (bVar7 == 0) {
          return true;
        }
        std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_268);
        cmTarget::SetProperty(local_270,(string *)&e,"98");
        std::__cxx11::string::~string((string *)&e);
        return true;
      }
    }
    else {
      cmStrCmp::cmStrCmp(&local_228,"11");
      ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,&PTR_anon_var_dwarf_2d6da4_005d66b8,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      if (ppcVar4 <= ppuVar5) goto LAB_002f9d7a;
      if ((bVar1 & bVar8) != 0) goto LAB_002f9dd5;
    }
    std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_268);
    cmTarget::SetProperty(local_270,(string *)&e,"11");
  }
  std::__cxx11::string::~string((string *)&e);
  return true;
}

Assistant:

bool cmMakefile::
AddRequiredTargetCxxFeature(cmTarget *target,
                            const std::string& feature) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14);

  const char *existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard)
    {
    if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                  cmStrCmp(existingCxxStandard)) == cmArrayEnd(CXX_STANDARDS))
      {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }
  const char * const *existingCxxIt = existingCxxStandard
                                    ? std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp(existingCxxStandard))
                                    : cmArrayEnd(CXX_STANDARDS);

  bool setCxx98 = needCxx98 && !existingCxxStandard;
  bool setCxx11 = needCxx11 && !existingCxxStandard;
  bool setCxx14 = needCxx14 && !existingCxxStandard;

  if (needCxx14 && existingCxxStandard && existingCxxIt <
                                    std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("14")))
    {
    setCxx14 = true;
    }
  else if (needCxx11 && existingCxxStandard && existingCxxIt <
                                    std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("11")))
    {
    setCxx11 = true;
    }
  else if(needCxx98 && existingCxxStandard && existingCxxIt <
                                    std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("98")))
    {
    setCxx98 = true;
    }

  if (setCxx14)
    {
    target->SetProperty("CXX_STANDARD", "14");
    }
  else if (setCxx11)
    {
    target->SetProperty("CXX_STANDARD", "11");
    }
  else if (setCxx98)
    {
    target->SetProperty("CXX_STANDARD", "98");
    }
  return true;
}